

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecryptionHelper.cpp
# Opt level: O3

bool HasCryptFilterDefinition(PDFParser *inParser,PDFStreamInput *inStream)

{
  PDFObject *this;
  EPDFObjectType EVar1;
  int iVar2;
  PDFDictionary *inDictionary;
  PDFName *this_00;
  unsigned_long uVar3;
  PDFObject *inOriginal;
  string *psVar4;
  ulong i;
  bool bVar5;
  PDFObjectCastPtr<PDFName> filterObjectItem;
  RefCountPtr<PDFObject> filterObject;
  RefCountPtr<PDFDictionary> streamDictionary;
  string local_70;
  RefCountPtr<PDFObject> local_50;
  RefCountPtr<PDFDictionary> local_40;
  
  inDictionary = PDFStreamInput::QueryStreamDictionary(inStream);
  local_40._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5810;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_40.mValue = inDictionary;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Filter","");
  this_00 = (PDFName *)PDFParser::QueryDictionaryObject(inParser,inDictionary,&local_70);
  local_50._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5870;
  local_50.mValue = (PDFObject *)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (this_00 != (PDFName *)0x0) {
    EVar1 = PDFObject::GetType((PDFObject *)this_00);
    this = local_50.mValue;
    if (EVar1 == ePDFObjectArray) {
      bVar5 = false;
      i = 0;
      while( true ) {
        uVar3 = PDFArray::GetLength((PDFArray *)this);
        if ((bool)(uVar3 <= i | bVar5)) break;
        inOriginal = PDFArray::QueryObject((PDFArray *)this,i);
        local_70._M_string_length = (size_type)PDFObjectCast<PDFName>(inOriginal);
        local_70._M_dataplus._M_p = (pointer)&PTR__RefCountPtr_003a5978;
        if ((PDFName *)local_70._M_string_length == (PDFName *)0x0) {
          RefCountPtr<PDFName>::~RefCountPtr((RefCountPtr<PDFName> *)&local_70);
          goto LAB_002031e4;
        }
        psVar4 = PDFName::GetValue_abi_cxx11_((PDFName *)local_70._M_string_length);
        iVar2 = std::__cxx11::string::compare((char *)psVar4);
        bVar5 = iVar2 == 0;
        RefCountPtr<PDFName>::~RefCountPtr((RefCountPtr<PDFName> *)&local_70);
        i = i + 1;
      }
      goto LAB_002031e7;
    }
    EVar1 = PDFObject::GetType(local_50.mValue);
    if (EVar1 == ePDFObjectName) {
      psVar4 = PDFName::GetValue_abi_cxx11_((PDFName *)local_50.mValue);
      iVar2 = std::__cxx11::string::compare((char *)psVar4);
      bVar5 = iVar2 == 0;
      goto LAB_002031e7;
    }
  }
LAB_002031e4:
  bVar5 = false;
LAB_002031e7:
  RefCountPtr<PDFObject>::~RefCountPtr(&local_50);
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_40);
  return bVar5;
}

Assistant:

bool HasCryptFilterDefinition(PDFParser* inParser, PDFStreamInput* inStream) {
	RefCountPtr<PDFDictionary> streamDictionary(inStream->QueryStreamDictionary());

	// check if stream has a crypt filter
	RefCountPtr<PDFObject> filterObject(inParser->QueryDictionaryObject(streamDictionary.GetPtr(), "Filter"));
	if (!filterObject)
	{
		// no filter, so stop here
		return false;
	}

	if (filterObject->GetType() == PDFObject::ePDFObjectArray)
	{
		PDFArray* filterObjectArray = (PDFArray*)filterObject.GetPtr();
		bool foundCrypt = false;
		for (unsigned long i = 0; i < filterObjectArray->GetLength() && !foundCrypt; ++i)
		{
			PDFObjectCastPtr<PDFName> filterObjectItem(filterObjectArray->QueryObject(i));
			if (!filterObjectItem)
			{
				// error
				break;
			}
			foundCrypt = filterObjectItem->GetValue() == "Crypt";
		}
		return foundCrypt;
	}
	else if (filterObject->GetType() == PDFObject::ePDFObjectName)
	{
		return ((PDFName*)(filterObject.GetPtr()))->GetValue() == "Crypt";
	}
	else
		return false; //???
}